

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall
QPDF::JSONReactor::replaceObject(JSONReactor *this,QPDFObjectHandle *replacement,JSON *value)

{
  QPDF *this_00;
  bool bVar1;
  qpdf_offset_t offset;
  bool local_b1;
  byte local_a1;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  QPDFObjGen local_78;
  allocator<char> local_59;
  string local_58;
  QPDFObjGen local_38;
  QPDFObjGen local_30;
  QPDFObjGen og;
  value_type *tos;
  JSON *value_local;
  QPDFObjectHandle *replacement_local;
  JSONReactor *this_local;
  
  og = (QPDFObjGen)
       std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
       back(&this->stack);
  local_30 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)((long)og + 8));
  bVar1 = QPDFObjectHandle::isIndirect(replacement);
  local_a1 = 0;
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isStream(replacement);
    local_b1 = false;
    if (bVar1) {
      local_38 = QPDFObjectHandle::getObjGen(replacement);
      local_b1 = QPDFObjGen::operator==(&local_38,&local_30);
    }
    local_a1 = local_b1 ^ 0xff;
  }
  if ((local_a1 & 1) == 0) {
    this_00 = this->pdf;
    local_78 = local_30;
    QPDFObjectHandle::QPDFObjectHandle(&local_88,replacement);
    QPDF::replaceObject(this_00,local_78,&local_88);
    QPDFObjectHandle::~QPDFObjectHandle(&local_88);
    getObject((QPDF *)&local_98,(QPDFObjGen)this->pdf);
    QPDFObjectHandle::operator=(&this->next_obj,&local_98);
    QPDFObjectHandle::~QPDFObjectHandle(&local_98);
    setObjectDescription(this,(QPDFObjectHandle *)((long)og + 8),value);
  }
  else {
    offset = QPDFObjectHandle::getParsedOffset(replacement);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"the value of an object may not be an indirect object reference",
               &local_59);
    error(this,offset,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::replaceObject(QPDFObjectHandle&& replacement, JSON const& value)
{
    auto& tos = stack.back();
    auto og = tos.object.getObjGen();
    if (replacement.isIndirect() && !(replacement.isStream() && replacement.getObjGen() == og)) {
        error(
            replacement.getParsedOffset(),
            "the value of an object may not be an indirect object reference");
        return;
    }
    pdf.replaceObject(og, replacement);
    next_obj = pdf.getObject(og);
    setObjectDescription(tos.object, value);
}